

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

void __thiscall re2::DFA::AddToQueue(DFA *this,Workq *q,int id,uint32_t flag)

{
  int *piVar1;
  RE2 *pRVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *pmVar3;
  bool bVar4;
  uint uVar5;
  EmptyOp EVar6;
  uint i;
  ostream *this_00;
  int iVar7;
  ulong uVar8;
  long lVar9;
  Inst *this_01;
  LogMessage local_1b0;
  
  piVar1 = (this->stack_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  *piVar1 = id;
  uVar8 = 1;
LAB_001e691d:
  iVar7 = (int)uVar8;
  if (iVar7 < 1) {
    return;
  }
  if ((int)(this->stack_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
           super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
           super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false> < iVar7) {
    __assert_fail("(nstk) <= (stack_.size())",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/re2-src/re2/dfa.cc"
                  ,0x340,"void re2::DFA::AddToQueue(Workq *, int, uint32_t)");
  }
  uVar8 = (ulong)(iVar7 - 1);
  i = piVar1[uVar8];
LAB_001e693c:
  do {
    if (i == 0) goto LAB_001e691d;
    if (i == 0xffffffff) {
      Workq::mark(q);
      goto LAB_001e691d;
    }
    bVar4 = SparseSetT<void>::contains(&q->super_SparseSet,i);
    if (bVar4) goto LAB_001e691d;
    Workq::insert_new(q,i);
    pRVar2 = this->prog_;
    lVar9 = (long)(int)i;
    pmVar3 = pRVar2->named_groups_;
    uVar5 = *(uint *)(pmVar3 + lVar9 * 8);
    if (5 < (uVar5 & 7) - 1) {
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/re2-src/re2/dfa.cc"
                 ,0x359);
      this_00 = std::operator<<((ostream *)&local_1b0.str_,"unhandled opcode: ");
      std::ostream::operator<<(this_00,*(uint *)(pmVar3 + lVar9 * 8) & 7);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    }
    iVar7 = (int)uVar8;
    switch(uVar5 & 7) {
    case 1:
      if ((uVar5 & 8) != 0) {
        __assert_fail("!ip->last()",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/re2-src/re2/dfa.cc"
                      ,0x373,"void re2::DFA::AddToQueue(Workq *, int, uint32_t)");
      }
      i = i + 1;
      goto LAB_001e693c;
    default:
      goto switchD_001e6994_caseD_2;
    case 3:
    case 6:
      this_01 = (Inst *)(pmVar3 + lVar9 * 8);
      if ((uVar5 & 8) == 0) {
        uVar8 = (ulong)(iVar7 + 1);
        piVar1[iVar7] = i + 1;
        uVar5 = this_01->out_opcode_;
      }
      if (((((uVar5 & 7) == 6) && (0 < q->maxmark_)) &&
          (i == *(uint *)((long)&(pRVar2->options_).max_mem_ + 4))) &&
         (i != (uint)(pRVar2->options_).max_mem_)) {
        iVar7 = (int)uVar8;
        uVar8 = (ulong)(iVar7 + 1);
        piVar1[iVar7] = -1;
        goto LAB_001e6a2c;
      }
      break;
    case 4:
      if ((uVar5 & 8) == 0) {
        uVar8 = (ulong)(iVar7 + 1);
        piVar1[iVar7] = i + 1;
      }
      this_01 = (Inst *)(pmVar3 + lVar9 * 8);
      EVar6 = Prog::Inst::empty(this_01);
      if ((~flag & EVar6) != 0) goto LAB_001e691d;
LAB_001e6a2c:
      uVar5 = this_01->out_opcode_;
    }
    i = uVar5 >> 4;
  } while( true );
switchD_001e6994_caseD_2:
  i = i + ((uVar5 & 8) >> 3 ^ 1);
  if ((uVar5 & 8) != 0) goto LAB_001e691d;
  goto LAB_001e693c;
}

Assistant:

void DFA::AddToQueue(Workq* q, int id, uint32_t flag) {

  // Use stack_ to hold our stack of instructions yet to process.
  // It was preallocated as follows:
  //   one entry per Capture;
  //   one entry per EmptyWidth; and
  //   one entry per Nop.
  // This reflects the maximum number of stack pushes that each can
  // perform. (Each instruction can be processed at most once.)
  // When using marks, we also added nmark == prog_->size().
  // (Otherwise, nmark == 0.)
  int* stk = stack_.data();
  int nstk = 0;

  stk[nstk++] = id;
  while (nstk > 0) {
    DCHECK_LE(nstk, stack_.size());
    id = stk[--nstk];

  Loop:
    if (id == Mark) {
      q->mark();
      continue;
    }

    if (id == 0)
      continue;

    // If ip is already on the queue, nothing to do.
    // Otherwise add it.  We don't actually keep all the
    // ones that get added, but adding all of them here
    // increases the likelihood of q->contains(id),
    // reducing the amount of duplicated work.
    if (q->contains(id))
      continue;
    q->insert_new(id);

    // Process instruction.
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstByteRange:  // just save these on the queue
      case kInstMatch:
        if (ip->last())
          break;
        id = id+1;
        goto Loop;

      case kInstCapture:    // DFA treats captures as no-ops.
      case kInstNop:
        if (!ip->last())
          stk[nstk++] = id+1;

        // If this instruction is the [00-FF]* loop at the beginning of
        // a leftmost-longest unanchored search, separate with a Mark so
        // that future threads (which will start farther to the right in
        // the input string) are lower priority than current threads.
        if (ip->opcode() == kInstNop && q->maxmark() > 0 &&
            id == prog_->start_unanchored() && id != prog_->start())
          stk[nstk++] = Mark;
        id = ip->out();
        goto Loop;

      case kInstAltMatch:
        DCHECK(!ip->last());
        id = id+1;
        goto Loop;

      case kInstEmptyWidth:
        if (!ip->last())
          stk[nstk++] = id+1;

        // Continue on if we have all the right flag bits.
        if (ip->empty() & ~flag)
          break;
        id = ip->out();
        goto Loop;
    }
  }
}